

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CNegativeXFB<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CNegativeXFB<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  allocator<unsigned_int> *this_00;
  GLuint GVar1;
  GLenum GVar2;
  ContextInfo *this_01;
  long lVar3;
  reference pvVar4;
  CallLogWrapper *this_02;
  DILogger local_848;
  DILogger local_6c8;
  DILogger local_548;
  DILogger local_3c8;
  undefined1 local_248 [8];
  DIResult result;
  undefined1 local_b8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> zarro;
  GLchar *varyings [1];
  allocator<char> local_61;
  string local_60;
  string local_40;
  byte local_19;
  CNegativeXFB<glcts::(anonymous_namespace)::test_api::ES3> *pCStack_18;
  bool drawWithXFBAllowed;
  CNegativeXFB<glcts::(anonymous_namespace)::test_api::ES3> *this_local;
  
  pCStack_18 = this;
  test_api::ES3::ES_Only();
  this_01 = deqp::Context::getContextInfo
                      ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context);
  local_19 = glu::ContextInfo::isExtensionSupported(this_01,"GL_EXT_geometry_shader");
  glcts::(anonymous_namespace)::CNegativeXFB<glcts::(anonymous_namespace)::test_api::ES3>::
  Vsh_abi_cxx11_(&local_40,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  GVar1 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,&local_40,&local_60,(string *)varyings,false);
  this->_program = GVar1;
  std::__cxx11::string::~string((string *)varyings);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::~string((string *)&local_40);
  zarro.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_460fd2;
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->_program,1,
             (GLchar **)
             &zarro.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0x8c8c);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->_program);
  lVar3 = DrawIndirectBase::CheckProgram(&this->super_DrawIndirectBase,this->_program);
  if (lVar3 == 0) {
    this_local = (CNegativeXFB<glcts::(anonymous_namespace)::test_api::ES3> *)&DAT_ffffffffffffffff;
  }
  else {
    this_02 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_02,this->_program);
    glu::CallLogWrapper::glGenVertexArrays(this_02,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_02,this->_vao);
    result.status_._4_4_ = 0;
    this_00 = (allocator<unsigned_int> *)((long)&result.status_ + 3);
    std::allocator<unsigned_int>::allocator(this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,0x1000,
               (value_type_conflict4 *)((long)&result.status_ + 4),this_00);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&result.status_ + 3))
    ;
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->_buffer);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,0x1000,pvVar4,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,4,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,this->_bufferIndirect);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,0x1000,pvVar4,0x88e4);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,this->_ebo);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,0x1000,pvVar4,0x88e4);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_xfb);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,this->_xfb);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0x1000,pvVar4,0x88e4);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0,this->_xfb);
    DIResult::DIResult((DIResult *)local_248);
    glu::CallLogWrapper::glBeginTransformFeedback
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glDrawElementsIndirect
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0x1405,(void *)0x0);
    if ((local_19 & 1) == 0) {
      GVar2 = glu::CallLogWrapper::glGetError
                        (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper);
      if (GVar2 != 0x502) {
        DIResult::error(&local_3c8,(DIResult *)local_248);
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)&local_3c8,
                   (char (*) [70])
                   "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
        DILogger::~DILogger(&local_3c8);
      }
    }
    glu::CallLogWrapper::glDrawArraysIndirect
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,(void *)0x0);
    if ((local_19 & 1) == 0) {
      GVar2 = glu::CallLogWrapper::glGetError
                        (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper);
      if (GVar2 != 0x502) {
        DIResult::error(&local_548,(DIResult *)local_248);
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)&local_548,
                   (char (*) [70])
                   "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
        DILogger::~DILogger(&local_548);
      }
    }
    glu::CallLogWrapper::glEndTransformFeedback
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper);
    glu::CallLogWrapper::glGenTransformFeedbacks
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_xfo);
    glu::CallLogWrapper::glBindTransformFeedback
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8e22,this->_xfo);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c8e,0,this->_xfb);
    glu::CallLogWrapper::glBeginTransformFeedback
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glPauseTransformFeedback
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper);
    glu::CallLogWrapper::glResumeTransformFeedback
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper);
    glu::CallLogWrapper::glDrawElementsIndirect
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0x1405,(void *)0x0);
    if ((local_19 & 1) == 0) {
      GVar2 = glu::CallLogWrapper::glGetError
                        (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper);
      if (GVar2 != 0x502) {
        DIResult::error(&local_6c8,(DIResult *)local_248);
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)&local_6c8,
                   (char (*) [70])
                   "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
        DILogger::~DILogger(&local_6c8);
      }
    }
    glu::CallLogWrapper::glDrawArraysIndirect
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,(void *)0x0);
    if ((local_19 & 1) == 0) {
      GVar2 = glu::CallLogWrapper::glGetError
                        (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper);
      if (GVar2 != 0x502) {
        DIResult::error(&local_848,(DIResult *)local_248);
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)&local_848,
                   (char (*) [70])
                   "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
        DILogger::~DILogger(&local_848);
      }
    }
    glu::CallLogWrapper::glEndTransformFeedback
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper);
    glu::CallLogWrapper::glBindTransformFeedback
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8e22,0);
    this_local = (CNegativeXFB<glcts::(anonymous_namespace)::test_api::ES3> *)
                 DIResult::code((DIResult *)local_248);
    DIResult::~DIResult((DIResult *)local_248);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		api::ES_Only();

		bool drawWithXFBAllowed = m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader");

		_program				 = CreateProgram(Vsh(), "", shaders::fshSimple<api>(), false);
		const GLchar* varyings[] = { "dataOut" };
		glTransformFeedbackVaryings(_program, 1, varyings, GL_INTERLEAVED_ATTRIBS);
		glLinkProgram(_program);
		if (!CheckProgram(_program))
		{
			return ERROR;
		}
		glUseProgram(_program);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		std::vector<GLuint> zarro(4096, 0);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);
		glBufferData(GL_ARRAY_BUFFER, 4096, &zarro[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, 0);
		glEnableVertexAttribArray(0);

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, 4096, &zarro[0], GL_STATIC_DRAW);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, 4096, &zarro[0], GL_STATIC_DRAW);

		glGenBuffers(1, &_xfb);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, _xfb);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 4096, &zarro[0], GL_STATIC_DRAW);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, _xfb);

		DIResult result;

		//Without XFO
		glBeginTransformFeedback(GL_POINTS);

		glDrawElementsIndirect(GL_POINTS, GL_UNSIGNED_INT, NULL);
		if (!drawWithXFBAllowed && glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}
		glDrawArraysIndirect(GL_POINTS, NULL);
		if (!drawWithXFBAllowed && glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}
		glEndTransformFeedback();

		//With XFO
		glGenTransformFeedbacks(1, &_xfo);
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, _xfo);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, _xfb);
		glBeginTransformFeedback(GL_POINTS);
		glPauseTransformFeedback();
		glResumeTransformFeedback();

		glDrawElementsIndirect(GL_POINTS, GL_UNSIGNED_INT, NULL);
		if (!drawWithXFBAllowed && glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}
		glDrawArraysIndirect(GL_POINTS, NULL);
		if (!drawWithXFBAllowed && glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}
		glEndTransformFeedback();

		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
		return result.code();
	}